

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O1

char * parse_tag(Btor2Parser *bfr)

{
  int ch;
  char *fmt;
  
  bfr->nbuf = 0;
  ch = getc_bfr(bfr);
  while (ch - 0x61U < 0x1a) {
    pushc_bfr(bfr,ch);
    ch = getc_bfr(bfr);
  }
  if (bfr->nbuf == 0) {
    fmt = "expected tag";
  }
  else {
    if (ch == 0x20) {
      pushc_bfr(bfr,0);
      return bfr->buf;
    }
    fmt = "expected space after tag";
  }
  perr_bfr(bfr,fmt);
  return (char *)0x0;
}

Assistant:

static const char *
parse_tag (Btor2Parser *bfr)
{
  int32_t ch;
  bfr->nbuf = 0;
  while ('a' <= (ch = getc_bfr (bfr)) && ch <= 'z') pushc_bfr (bfr, ch);
  if (!bfr->nbuf)
  {
    perr_bfr (bfr, "expected tag");
    return 0;
  }
  if (ch != ' ')
  {
    perr_bfr (bfr, "expected space after tag");
    return 0;
  }
  pushc_bfr (bfr, 0);
  return bfr->buf;
}